

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_tag.cpp
# Opt level: O0

void __thiscall despot::BaseTag::BaseTag(BaseTag *this)

{
  allocator<char> local_329;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_328;
  allocator<char> local_301;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  allocator<char> local_2d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  allocator<char> local_2b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b0;
  allocator<char> local_289;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_288;
  allocator<char> local_261;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  istringstream local_1a0 [8];
  istringstream iss;
  BaseTag *this_local;
  
  MDP::MDP(&this->super_MDP);
  despot::BeliefMDP::BeliefMDP(&this->super_BeliefMDP);
  StateIndexer::StateIndexer(&this->super_StateIndexer);
  StatePolicy::StatePolicy(&this->super_StatePolicy);
  MMAPInferencer::MMAPInferencer(&this->super_MMAPInferencer);
  *(undefined ***)this = &PTR__BaseTag_00159420;
  *(undefined ***)&this->super_BeliefMDP = &PTR__BaseTag_00159550;
  *(undefined ***)&this->super_StateIndexer = &PTR__BaseTag_00159658;
  *(undefined ***)&this->super_StatePolicy = &PTR__BaseTag_00159690;
  *(undefined ***)&this->super_MMAPInferencer = &PTR__BaseTag_001596b8;
  despot::Floor::Floor(&this->floor_);
  std::vector<despot::TagState_*,_std::allocator<despot::TagState_*>_>::vector(&this->states_);
  std::vector<int,_std::allocator<int>_>::vector(&this->rob_);
  std::vector<int,_std::allocator<int>_>::vector(&this->opp_);
  std::
  vector<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>,_std::allocator<std::vector<std::vector<despot::State,_std::allocator<despot::State>_>,_std::allocator<std::vector<despot::State,_std::allocator<despot::State>_>_>_>_>_>
  ::vector(&this->transition_probabilities_);
  MemoryPool<despot::TagState>::MemoryPool(&this->memory_pool_);
  std::vector<int,_std::allocator<int>_>::vector(&this->default_action_);
  this->robot_pos_unknown_ = false;
  current_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_260,"mapSize = 5 10\n",&local_261);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"#####...##\n",&local_289)
  ;
  std::operator+(&local_240,&local_260,&local_288);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b0,"#####...##\n",&local_2b1)
  ;
  std::operator+(&local_220,&local_240,&local_2b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"#####...##\n",&local_2d9)
  ;
  std::operator+(&local_200,&local_220,&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_300,"...........\n",&local_301);
  std::operator+(&local_1e0,&local_200,&local_300);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_328,"...........",&local_329);
  std::operator+(&local_1c0,&local_1e0,&local_328);
  std::__cxx11::istringstream::istringstream(local_1a0,(string *)&local_1c0,_S_in);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::__cxx11::string::~string((string *)&local_220);
  std::__cxx11::string::~string((string *)&local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_288);
  std::allocator<char>::~allocator(&local_289);
  std::__cxx11::string::~string((string *)&local_260);
  std::allocator<char>::~allocator(&local_261);
  Init(this,(istream *)local_1a0);
  std::__cxx11::istringstream::~istringstream(local_1a0);
  return;
}

Assistant:

BaseTag::BaseTag() :
  robot_pos_unknown_(false) {
	current_ = this;
	istringstream iss(
		string("mapSize = 5 10\n") + string("#####...##\n")
			+ string("#####...##\n") + string("#####...##\n")
			+ string("...........\n") + string("..........."));
	Init(iss);
}